

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

ParsedInt anon_unknown.dwarf_ba72a6::readInt(QStringView text)

{
  QStringView in;
  QLatin1StringView text_00;
  bool bVar1;
  char *s;
  size_type sz;
  storage_type_conflict *in_RSI;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  ParsedInt PVar2;
  QVarLengthArray<char,_256LL> latin1;
  QVarLengthArray<char,_256LL> *in_stack_fffffffffffffe50;
  qsizetype in_stack_fffffffffffffe58;
  QVarLengthArray<char,_256LL> *in_stack_fffffffffffffe60;
  QVLABaseBase *this;
  qsizetype in_stack_fffffffffffffe70;
  storage_type_conflict *in_stack_fffffffffffffe78;
  qsizetype in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  QLatin1String local_158;
  qsizetype local_148;
  storage_type_conflict *psStack_140;
  QStringView local_130;
  QVLABaseBase local_120 [11];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_130.m_size = in_RDI;
  local_130.m_data = in_RSI;
  bVar1 = QStringView::isEmpty((QStringView *)0x56b325);
  if (bVar1) {
    PVar2 = (ParsedInt)ZEXT816(0);
  }
  else {
    this = local_120;
    memset(this,0xaa,0x118);
    QStringView::size(&local_130);
    QVarLengthArray<char,_256LL>::QVarLengthArray
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    QVLABase<char>::data((QVLABase<char> *)this);
    local_148 = local_130.m_size;
    psStack_140 = local_130.m_data;
    in.m_data = in_stack_fffffffffffffe78;
    in.m_size = in_stack_fffffffffffffe70;
    QLatin1::convertFromUnicode((char *)this,in);
    s = QVLABase<char>::data((QVLABase<char> *)this);
    sz = QVLABaseBase::size(this);
    QLatin1String::QLatin1String(&local_158,s,sz);
    text_00.m_data = in_stack_fffffffffffffe88;
    text_00.m_size = in_stack_fffffffffffffe80;
    PVar2 = readInt(text_00);
    QVarLengthArray<char,_256LL>::~QVarLengthArray(in_stack_fffffffffffffe50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return PVar2;
  }
  __stack_chk_fail();
}

Assistant:

ParsedInt readInt(QStringView text)
{
    if (text.isEmpty())
        return {};

    // Converting to Latin-1 because QStringView::toULongLong() works with
    // US-ASCII only by design anyway.
    // Also QStringView::toULongLong() can't be used here as it will happily ignore
    // spaces and accept signs; but various date formats' fields (e.g. all in ISO)
    // should not.
    QVarLengthArray<char> latin1(text.size());
    QLatin1::convertFromUnicode(latin1.data(), text);
    return readInt(QLatin1StringView{latin1.data(), latin1.size()});
}